

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

uintptr_t tlp_mr_addr(tlp_mr_hdr *mh)

{
  __uint32_t _Var1;
  byte *in_RDI;
  uint64_t *addr64;
  uint32_t *addr32;
  uintptr_t addr;
  int n;
  ulong local_18;
  int local_c;
  
  if ((*in_RDI & 0x20) == 0) {
    _Var1 = __bswap_32(*(__uint32_t *)(in_RDI + 8));
    local_18 = (ulong)_Var1;
  }
  else {
    local_18 = __bswap_64(*(__uint64_t *)(in_RDI + 8));
  }
  if (((in_RDI[7] & 0xf) != 0) && ((in_RDI[7] & 0xf) != 0xf)) {
    local_c = 0;
    while ((local_c < 4 && (((uint)(in_RDI[7] & 0xf) & 1 << ((byte)local_c & 0x1f)) == 0))) {
      local_18 = local_18 + 1;
      local_c = local_c + 1;
    }
  }
  return local_18;
}

Assistant:

uintptr_t tlp_mr_addr(struct tlp_mr_hdr *mh)
{
	int n;
	uintptr_t addr;
	uint32_t *addr32;
	uint64_t *addr64;

	if (tlp_is_3dw(mh->tlp.fmt_type)) {
		addr32 = (uint32_t *)(mh + 1);
		addr = be32toh(*addr32);
	} else {
		addr64 = (uint64_t *)(mh + 1);
		addr = be64toh(*addr64);
	}
	
	/* move forard the address in accordance with the 1st DW BE */
	if (mh->fstdw && mh->fstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->fstdw & (0x1 << n)) == 0) {
				addr += 1;
			} else
				break;
		}
	}

	return addr;
}